

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_blockwise_nl_join.cpp
# Opt level: O3

void __thiscall
duckdb::BlockwiseNLJoinState::BlockwiseNLJoinState
          (BlockwiseNLJoinState *this,ExecutionContext *context,ColumnDataCollection *rhs,
          PhysicalBlockwiseNLJoin *op)

{
  ClientContext *context_00;
  bool enabled_p;
  type expression;
  
  (this->super_CachingOperatorState).cached_chunk.
  super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
  super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl = (DataChunk *)0x0;
  (this->super_CachingOperatorState).initialized = false;
  (this->super_CachingOperatorState).can_cache_chunk = false;
  (this->super_CachingOperatorState).super_OperatorState._vptr_OperatorState =
       (_func_int **)&PTR__BlockwiseNLJoinState_02463b48;
  this->op = op;
  CrossProductExecutor::CrossProductExecutor(&this->cross_product,rhs);
  enabled_p = IsLeftOuterJoin((op->super_PhysicalJoin).super_CachingPhysicalOperator.field_0x81);
  OuterJoinMarker::OuterJoinMarker(&this->left_outer,enabled_p);
  SelectionVector::SelectionVector(&this->match_sel,0x800);
  context_00 = context->client;
  expression = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&op->condition);
  ExpressionExecutor::ExpressionExecutor(&this->executor,context_00,expression);
  DataChunk::DataChunk(&this->intermediate_chunk);
  OuterJoinMarker::Initialize(&this->left_outer,0x800);
  if ((byte)((this->op->super_PhysicalJoin).super_CachingPhysicalOperator.field_0x81 - 5) < 2) {
    switchD_01043a80::default(this->found_match,0,0x800);
    return;
  }
  return;
}

Assistant:

explicit BlockwiseNLJoinState(ExecutionContext &context, ColumnDataCollection &rhs,
	                              const PhysicalBlockwiseNLJoin &op)
	    : op(op), cross_product(rhs), left_outer(IsLeftOuterJoin(op.join_type)), match_sel(STANDARD_VECTOR_SIZE),
	      executor(context.client, *op.condition) {
		left_outer.Initialize(STANDARD_VECTOR_SIZE);
		ResetMatches();
	}